

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointPoint.cpp
# Opt level: O3

void __thiscall chrono::fea::ChLinkPointPoint::ConstraintsLoadJacobians(ChLinkPointPoint *this)

{
  PointerType pdVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ChMatrix33<double> Jxb;
  ChMatrix33<double> Jxa;
  ChRowVectorRef local_d8;
  undefined8 local_b8;
  undefined1 auStack_b0 [24];
  undefined8 local_98;
  undefined1 auStack_90 [24];
  undefined8 local_78;
  undefined8 local_70;
  undefined1 auStack_68 [24];
  undefined8 local_50;
  undefined1 auStack_48 [24];
  undefined8 local_30;
  
  auStack_48 = ZEXT824(0);
  auStack_68._16_8_ = 0;
  auStack_68._0_16_ = ZEXT816(0) << 0x40;
  local_70 = 0x3ff0000000000000;
  local_50 = 0x3ff0000000000000;
  auStack_90 = ZEXT824(0);
  auStack_b0._16_8_ = 0;
  auStack_b0._0_16_ = ZEXT816(0) << 0x40;
  local_b8 = 0xbff0000000000000;
  local_98 = 0xbff0000000000000;
  local_30 = 0x3ff0000000000000;
  local_78 = 0xbff0000000000000;
  ChConstraintTwoGeneric::Get_Cq_a(&local_d8,&this->constraint1);
  pdVar1 = local_d8.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
           .m_data;
  if (local_d8.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>.
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
      .m_cols.m_value < 3) goto LAB_0061f290;
  uVar3 = 3;
  if (((ulong)local_d8.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
              .m_data & 7) == 0) {
    uVar2 = -((uint)((ulong)local_d8.
                            super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                            .
                            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                            .
                            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                            .m_data >> 3) & 0x1fffffff) & 7;
    if (uVar2 < 3) {
      uVar3 = uVar2;
    }
    if (uVar2 != 0) goto LAB_0061efde;
  }
  else {
LAB_0061efde:
    memcpy(local_d8.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
           .m_data,&local_70,(ulong)(uVar3 * 8));
  }
  if (uVar3 < 3) {
    uVar4 = (ulong)(uVar3 << 3);
    memcpy((void *)((long)pdVar1 + uVar4),auStack_68 + (uVar4 - 8),0x18 - uVar4);
  }
  ChConstraintTwoGeneric::Get_Cq_a(&local_d8,&this->constraint2);
  pdVar1 = local_d8.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
           .m_data;
  if (local_d8.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>.
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
      .m_cols.m_value < 3) goto LAB_0061f290;
  uVar3 = 3;
  if (((ulong)local_d8.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
              .m_data & 7) == 0) {
    uVar2 = -((uint)((ulong)local_d8.
                            super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                            .
                            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                            .
                            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                            .m_data >> 3) & 0x1fffffff) & 7;
    if (uVar2 < 3) {
      uVar3 = uVar2;
    }
    if (uVar2 != 0) goto LAB_0061f05d;
  }
  else {
LAB_0061f05d:
    memcpy(local_d8.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
           .m_data,auStack_68 + 0x10,(ulong)(uVar3 * 8));
  }
  if (uVar3 < 3) {
    uVar4 = (ulong)(uVar3 << 3);
    memcpy((void *)((long)pdVar1 + uVar4),auStack_68 + uVar4 + 0x10,0x18 - uVar4);
  }
  ChConstraintTwoGeneric::Get_Cq_a(&local_d8,&this->constraint3);
  pdVar1 = local_d8.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
           .m_data;
  if (local_d8.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>.
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
      .m_cols.m_value < 3) goto LAB_0061f290;
  uVar3 = 3;
  if (((ulong)local_d8.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
              .m_data & 7) == 0) {
    uVar2 = -((uint)((ulong)local_d8.
                            super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                            .
                            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                            .
                            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                            .m_data >> 3) & 0x1fffffff) & 7;
    if (uVar2 < 3) {
      uVar3 = uVar2;
    }
    if (uVar2 != 0) goto LAB_0061f0e2;
  }
  else {
LAB_0061f0e2:
    memcpy(local_d8.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
           .m_data,auStack_48 + 8,(ulong)(uVar3 * 8));
  }
  if (uVar3 < 3) {
    uVar4 = (ulong)(uVar3 << 3);
    memcpy((void *)((long)pdVar1 + uVar4),auStack_48 + uVar4 + 8,0x18 - uVar4);
  }
  ChConstraintTwoGeneric::Get_Cq_b(&local_d8,&this->constraint1);
  pdVar1 = local_d8.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
           .m_data;
  if (local_d8.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>.
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
      .m_cols.m_value < 3) goto LAB_0061f290;
  uVar3 = 3;
  if (((ulong)local_d8.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
              .m_data & 7) == 0) {
    uVar2 = -((uint)((ulong)local_d8.
                            super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                            .
                            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                            .
                            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                            .m_data >> 3) & 0x1fffffff) & 7;
    if (uVar2 < 3) {
      uVar3 = uVar2;
    }
    if (uVar2 != 0) goto LAB_0061f160;
  }
  else {
LAB_0061f160:
    memcpy(local_d8.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
           .m_data,&local_b8,(ulong)(uVar3 * 8));
  }
  if (uVar3 < 3) {
    uVar4 = (ulong)(uVar3 << 3);
    memcpy((void *)((long)pdVar1 + uVar4),auStack_b0 + (uVar4 - 8),0x18 - uVar4);
  }
  ChConstraintTwoGeneric::Get_Cq_b(&local_d8,&this->constraint2);
  pdVar1 = local_d8.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
           .m_data;
  if (local_d8.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>.
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
      .m_cols.m_value < 3) goto LAB_0061f290;
  uVar3 = 3;
  if (((ulong)local_d8.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
              .m_data & 7) == 0) {
    uVar2 = -((uint)((ulong)local_d8.
                            super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                            .
                            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                            .
                            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                            .m_data >> 3) & 0x1fffffff) & 7;
    if (uVar2 < 3) {
      uVar3 = uVar2;
    }
    if (uVar2 != 0) goto LAB_0061f1d7;
  }
  else {
LAB_0061f1d7:
    memcpy(local_d8.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
           .m_data,auStack_b0 + 0x10,(ulong)(uVar3 * 8));
  }
  if (uVar3 < 3) {
    uVar4 = (ulong)(uVar3 << 3);
    memcpy((void *)((long)pdVar1 + uVar4),auStack_b0 + uVar4 + 0x10,0x18 - uVar4);
  }
  ChConstraintTwoGeneric::Get_Cq_b(&local_d8,&this->constraint3);
  if (local_d8.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>.
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
      .m_cols.m_value < 3) {
LAB_0061f290:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, 1, -1>>, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, 1, -1>>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                 );
  }
  uVar3 = 3;
  if (((ulong)local_d8.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
              .m_data & 7) == 0) {
    uVar2 = -((uint)((ulong)local_d8.
                            super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                            .
                            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                            .
                            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                            .m_data >> 3) & 0x1fffffff) & 7;
    if (uVar2 < 3) {
      uVar3 = uVar2;
    }
    if (uVar2 == 0) goto LAB_0061f25d;
  }
  memcpy(local_d8.
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
         .m_data,auStack_90 + 8,(ulong)(uVar3 * 8));
LAB_0061f25d:
  if (uVar3 < 3) {
    uVar4 = (ulong)(uVar3 << 3);
    memcpy((void *)((long)local_d8.
                          super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                          .
                          super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          .
                          super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                          .m_data + uVar4),auStack_90 + uVar4 + 8,0x18 - uVar4);
  }
  return;
}

Assistant:

void ChLinkPointPoint::ConstraintsLoadJacobians() {
    // compute jacobians
    ChMatrix33<> Jxa(1.0);

    ChMatrix33<> Jxb(-1.0);

    constraint1.Get_Cq_a().segment(0, 3) = Jxa.row(0);
    constraint2.Get_Cq_a().segment(0, 3) = Jxa.row(1);
    constraint3.Get_Cq_a().segment(0, 3) = Jxa.row(2);

    constraint1.Get_Cq_b().segment(0, 3) = Jxb.row(0);
    constraint2.Get_Cq_b().segment(0, 3) = Jxb.row(1);
    constraint3.Get_Cq_b().segment(0, 3) = Jxb.row(2);
}